

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::SupportVectorRegressor::ByteSizeLong(SupportVectorRegressor *this)

{
  Coefficients *pCVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  if (this->kernel_ == (Kernel *)0x0 ||
      this == (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = Kernel::ByteSizeLong(this->kernel_);
    uVar4 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  pCVar1 = this->coefficients_;
  if (pCVar1 != (Coefficients *)0x0 &&
      this != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    uVar5 = (ulong)(uint)(pCVar1->alpha_).current_size_;
    lVar6 = uVar5 * 8;
    uVar4 = (uint)lVar6;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else if ((int)uVar4 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    pCVar1->_alpha_cached_byte_size_ = uVar4;
    lVar6 = uVar5 + lVar6;
    uVar4 = (uint)lVar6;
    pCVar1->_cached_size_ = uVar4;
    uVar4 = uVar4 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + lVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar7 = sVar3;
  if (this->rho_ != 0.0) {
    sVar7 = sVar3 + 9;
  }
  if (NAN(this->rho_)) {
    sVar7 = sVar3 + 9;
  }
  if (this->_oneof_case_[0] == 3) {
    sVar3 = DenseSupportVectors::ByteSizeLong((this->supportVectors_).densesupportvectors_);
  }
  else {
    if (this->_oneof_case_[0] != 2) goto LAB_004d66a8;
    sVar3 = SparseSupportVectors::ByteSizeLong((this->supportVectors_).sparsesupportvectors_);
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar7 = sVar7 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
LAB_004d66a8:
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t SupportVectorRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->has_coefficients()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->coefficients_);
  }

  // double rho = 5;
  if (this->rho() != 0) {
    total_size += 1 + 8;
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}